

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O3

void __thiscall QZipStreamStrategy::QZipStreamStrategy(QZipStreamStrategy *this,QIODevice *device)

{
  QBuffer *this_00;
  QBuffer *this_01;
  QZipWriter *this_02;
  QXmlStreamWriter *this_03;
  QArrayData *pQVar1;
  char16_t *pcVar2;
  ulong uVar3;
  QAnyStringView QVar4;
  char16_t *pcVar5;
  size_t in_R9;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QByteArrayView QVar11;
  QAnyStringView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QString local_a0;
  char16_t *local_88;
  ulong uStack_80;
  QString local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QOutputStrategy).contentStream = (QIODevice *)0x0;
  (this->super_QOutputStrategy).counter = 1;
  (this->super_QOutputStrategy)._vptr_QOutputStrategy =
       (_func_int **)&PTR__QZipStreamStrategy_007e0d18;
  this_00 = &this->content;
  QBuffer::QBuffer(this_00,(QObject *)0x0);
  this_01 = &this->manifest;
  QBuffer::QBuffer(this_01,(QObject *)0x0);
  this_02 = &this->zip;
  QZipWriter::QZipWriter(this_02,device);
  this_03 = &this->manifestWriter;
  QXmlStreamWriter::QXmlStreamWriter(this_03,(QIODevice *)this_01);
  (this->manifestNS).d.size = 0;
  (this->manifestNS).d.d = (Data *)0x0;
  (this->manifestNS).d.ptr = (char16_t *)0x0;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_58,"application/vnd.oasis.opendocument.text",-1);
  QZipWriter::setCompressionPolicy((CompressionPolicy)this_02);
  QVar7.m_data = &DAT_00000008;
  QVar7.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar7);
  QZipWriter::addFile((QString *)this_02,(QByteArray *)&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QZipWriter::setCompressionPolicy((CompressionPolicy)this_02);
  (this->super_QOutputStrategy).contentStream = (QIODevice *)this_00;
  QBuffer::open(this_00,2);
  QBuffer::open(this_01,2);
  QVar8.m_data = (storage_type *)0x32;
  QVar8.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar8);
  pQVar1 = &((this->manifestNS).d.d)->super_QArrayData;
  pcVar2 = (this->manifestNS).d.ptr;
  (this->manifestNS).d.d = local_78.d.d;
  (this->manifestNS).d.ptr = local_78.d.ptr;
  uVar3 = (this->manifestNS).d.size;
  (this->manifestNS).d.size = local_78.d.size;
  local_78.d.d = (Data *)pQVar1;
  local_78.d.ptr = pcVar2;
  local_78.d.size = uVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  QXmlStreamWriter::setAutoFormatting(SUB81(this_03,0));
  QXmlStreamWriter::setAutoFormattingIndent((int)this_03);
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  QVar9.m_data = &DAT_00000008;
  QVar9.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar9);
  QVar10.m_size = (size_t)pcVar2;
  QVar10.field_0.m_data_utf8 = (char *)this_03;
  QVar19.m_size = (size_t)local_78.d.ptr;
  QVar19.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QXmlStreamWriter::writeNamespace(QVar10,QVar19);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QXmlStreamWriter::writeStartDocument();
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  QVar11.m_data = &DAT_00000008;
  QVar11.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar11);
  QVar12.m_size = (size_t)pcVar2;
  QVar12.field_0.m_data_utf8 = (char *)this_03;
  QVar20.m_size = (size_t)local_78.d.ptr;
  QVar20.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar12,QVar20);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar2 = (this->manifestNS).d.ptr;
  uVar3 = (this->manifestNS).d.size;
  QVar13.m_data = (storage_type *)0x7;
  QVar13.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar13);
  pcVar5 = local_78.d.ptr;
  aVar6.m_data = (void *)(local_78.d.size | 0x8000000000000000);
  QVar14.m_data = (storage_type *)0x3;
  QVar14.m_size = (qsizetype)&local_a0;
  QString::fromLatin1(QVar14);
  local_88 = local_a0.d.ptr;
  uStack_80 = local_a0.d.size | 0x8000000000000000;
  QVar4.m_size = (size_t)pcVar2;
  QVar4.field_0.m_data_utf8 = (char *)this_03;
  QVar21.m_size = (size_t)pcVar5;
  QVar21.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QVar22.m_size = in_R9;
  QVar22.field_0.m_data = aVar6.m_data;
  QXmlStreamWriter::writeAttribute(QVar4,QVar21,QVar22);
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar15.m_data = (storage_type *)0x1;
  QVar15.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar15);
  QVar16.m_data = (storage_type *)0x27;
  QVar16.m_size = (qsizetype)&local_a0;
  QString::fromLatin1(QVar16);
  addFile(this,&local_78,&local_a0);
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar17.m_data = (storage_type *)0xb;
  QVar17.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar17);
  QVar18.m_data = &DAT_00000008;
  QVar18.m_size = (qsizetype)&local_a0;
  QString::fromLatin1(QVar18);
  addFile(this,&local_78,&local_a0);
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QZipStreamStrategy(QIODevice *device)
        : zip(device),
        manifestWriter(&manifest)
    {
        QByteArray mime("application/vnd.oasis.opendocument.text");
        zip.setCompressionPolicy(QZipWriter::NeverCompress);
        zip.addFile(QString::fromLatin1("mimetype"), mime); // for mime-magick
        zip.setCompressionPolicy(QZipWriter::AutoCompress);
        contentStream = &content;
        content.open(QIODevice::WriteOnly);
        manifest.open(QIODevice::WriteOnly);

        manifestNS = QString::fromLatin1("urn:oasis:names:tc:opendocument:xmlns:manifest:1.0");
        // prettyfy
        manifestWriter.setAutoFormatting(true);
        manifestWriter.setAutoFormattingIndent(1);

        manifestWriter.writeNamespace(manifestNS, QString::fromLatin1("manifest"));
        manifestWriter.writeStartDocument();
        manifestWriter.writeStartElement(manifestNS, QString::fromLatin1("manifest"));
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("version"), QString::fromLatin1("1.2"));
        addFile(QString::fromLatin1("/"), QString::fromLatin1("application/vnd.oasis.opendocument.text"));
        addFile(QString::fromLatin1("content.xml"), QString::fromLatin1("text/xml"));
    }